

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interpreter.cpp
# Opt level: O3

shared_ptr<ScriptAstNode> parseScript(ostream *out,string *data)

{
  bool bVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  shared_ptr<ScriptAstNode> sVar3;
  undefined1 local_90 [8];
  shared_ptr<TokenBuffer> tokenBuffer;
  shared_ptr<SemanticAnalyzer> analyzer;
  shared_ptr<Parser> parser;
  shared_ptr<StringReader> reader;
  optional<std::shared_ptr<ScriptAstNode>_> maybeScript;
  
  parser.super___shared_ptr<Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<StringReader,std::allocator<StringReader>,std::__cxx11::string_const&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&reader,
             (StringReader **)
             &parser.super___shared_ptr<Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (_Sp_alloc_shared_tag<std::allocator<StringReader>_>)
             &reader.super___shared_ptr<StringReader,_(__gnu_cxx::_Lock_policy)2>._M_refcount,in_RDX
            );
  this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x48);
  this->_M_use_count = 1;
  this->_M_weak_count = 1;
  this->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0012f7f8;
  __gnu_cxx::new_allocator<Tokenizer>::construct<Tokenizer,std::shared_ptr<StringReader>&>
            ((new_allocator<Tokenizer> *)
             &reader.super___shared_ptr<StringReader,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (Tokenizer *)(this + 1),
             (shared_ptr<StringReader> *)
             &parser.super___shared_ptr<Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  tokenBuffer.super___shared_ptr<TokenBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)operator_new(0x38);
  ((tokenBuffer.super___shared_ptr<TokenBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->tokenList).
  super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>._M_impl._M_node
  .super__List_node_base._M_prev = (_List_node_base *)0x100000001;
  ((tokenBuffer.super___shared_ptr<TokenBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->tokenList).
  super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>._M_impl._M_node
  .super__List_node_base._M_next = (_List_node_base *)&PTR___Sp_counted_ptr_inplace_0012f898;
  if (__libc_single_threaded == '\0') {
    LOCK();
    this->_M_use_count = this->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this->_M_use_count = this->_M_use_count + 1;
  }
  local_90 = (undefined1  [8])
             &((tokenBuffer.super___shared_ptr<TokenBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              tokenList).
              super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>.
              _M_impl._M_node._M_size;
  ((tokenBuffer.super___shared_ptr<TokenBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->tokenizer).
  super___shared_ptr<Tokenizer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)local_90;
  ((tokenBuffer.super___shared_ptr<TokenBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->tokenList).
  super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>._M_impl._M_node
  ._M_size = (size_t)local_90;
  ((tokenBuffer.super___shared_ptr<TokenBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->tokenizer).
  super___shared_ptr<Tokenizer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  tokenBuffer.super___shared_ptr<TokenBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].tokenList.
  super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>._M_impl._M_node
  .super__List_node_base._M_next = (_List_node_base *)(this + 1);
  tokenBuffer.super___shared_ptr<TokenBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].tokenList.
  super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>._M_impl._M_node
  .super__List_node_base._M_prev = (_List_node_base *)this;
  analyzer.super___shared_ptr<SemanticAnalyzer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Parser,std::allocator<Parser>,std::shared_ptr<TokenBuffer>&,std::ostream&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&parser,
             (Parser **)
             &analyzer.super___shared_ptr<SemanticAnalyzer,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (_Sp_alloc_shared_tag<std::allocator<Parser>_>)
             &reader.super___shared_ptr<StringReader,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (shared_ptr<TokenBuffer> *)local_90,
             (basic_ostream<char,_std::char_traits<char>_> *)data);
  Parser::parseScript((optional<std::shared_ptr<ScriptAstNode>_> *)
                      &reader.super___shared_ptr<StringReader,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount,
                      (Parser *)
                      analyzer.super___shared_ptr<SemanticAnalyzer,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi);
  if (maybeScript.super__Optional_base<std::shared_ptr<ScriptAstNode>,_false,_false>._M_payload.
      super__Optional_payload<std::shared_ptr<ScriptAstNode>,_true,_false,_false>.
      super__Optional_payload_base<std::shared_ptr<ScriptAstNode>_>._M_payload._8_1_ != '\0') {
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)out =
         reader.super___shared_ptr<StringReader,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    *(element_type **)(out + 8) =
         maybeScript.super__Optional_base<std::shared_ptr<ScriptAstNode>,_false,_false>._M_payload.
         super__Optional_payload<std::shared_ptr<ScriptAstNode>,_true,_false,_false>.
         super__Optional_payload_base<std::shared_ptr<ScriptAstNode>_>._M_payload._M_value.
         super___shared_ptr<ScriptAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (maybeScript.super__Optional_base<std::shared_ptr<ScriptAstNode>,_false,_false>._M_payload.
        super__Optional_payload<std::shared_ptr<ScriptAstNode>,_true,_false,_false>.
        super__Optional_payload_base<std::shared_ptr<ScriptAstNode>_>._M_payload._M_value.
        super___shared_ptr<ScriptAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0)
    {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&((maybeScript.super__Optional_base<std::shared_ptr<ScriptAstNode>,_false,_false>.
                   _M_payload.
                   super__Optional_payload<std::shared_ptr<ScriptAstNode>,_true,_false,_false>.
                   super__Optional_payload_base<std::shared_ptr<ScriptAstNode>_>._M_payload._M_value
                   .super___shared_ptr<ScriptAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 statements).
                 super__Vector_base<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
                 ._M_impl.super__Vector_impl_data._M_start =
             *(int *)&((maybeScript.
                        super__Optional_base<std::shared_ptr<ScriptAstNode>,_false,_false>.
                        _M_payload.
                        super__Optional_payload<std::shared_ptr<ScriptAstNode>,_true,_false,_false>.
                        super__Optional_payload_base<std::shared_ptr<ScriptAstNode>_>._M_payload.
                        _M_value.super___shared_ptr<ScriptAstNode,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->statements).
                      super__Vector_base<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + 1;
        UNLOCK();
      }
      else {
        *(int *)&((maybeScript.super__Optional_base<std::shared_ptr<ScriptAstNode>,_false,_false>.
                   _M_payload.
                   super__Optional_payload<std::shared_ptr<ScriptAstNode>,_true,_false,_false>.
                   super__Optional_payload_base<std::shared_ptr<ScriptAstNode>_>._M_payload._M_value
                   .super___shared_ptr<ScriptAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 statements).
                 super__Vector_base<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
                 ._M_impl.super__Vector_impl_data._M_start =
             *(int *)&((maybeScript.
                        super__Optional_base<std::shared_ptr<ScriptAstNode>,_false,_false>.
                        _M_payload.
                        super__Optional_payload<std::shared_ptr<ScriptAstNode>,_true,_false,_false>.
                        super__Optional_payload_base<std::shared_ptr<ScriptAstNode>_>._M_payload.
                        _M_value.super___shared_ptr<ScriptAstNode,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->statements).
                      super__Vector_base<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + 1;
      }
    }
    tokenBuffer.super___shared_ptr<TokenBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<SemanticAnalyzer,std::allocator<SemanticAnalyzer>,std::ostream&,std::shared_ptr<StringReader>&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&analyzer,
               (SemanticAnalyzer **)
               &tokenBuffer.super___shared_ptr<TokenBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (_Sp_alloc_shared_tag<std::allocator<SemanticAnalyzer>_>)
               &maybeScript.super__Optional_base<std::shared_ptr<ScriptAstNode>,_false,_false>.
                _M_payload.
                super__Optional_payload<std::shared_ptr<ScriptAstNode>,_true,_false,_false>.
                super__Optional_payload_base<std::shared_ptr<ScriptAstNode>_>.field_0x17,
               (basic_ostream<char,_std::char_traits<char>_> *)data,
               (shared_ptr<StringReader> *)
               &parser.super___shared_ptr<Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    bVar1 = SemanticAnalyzer::isValid
                      ((SemanticAnalyzer *)
                       tokenBuffer.super___shared_ptr<TokenBuffer,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi,(shared_ptr<ScriptAstNode> *)out);
    if (bVar1) {
      if (analyzer.super___shared_ptr<SemanticAnalyzer,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   analyzer.super___shared_ptr<SemanticAnalyzer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
        ;
      }
      if (maybeScript.super__Optional_base<std::shared_ptr<ScriptAstNode>,_false,_false>._M_payload.
          super__Optional_payload<std::shared_ptr<ScriptAstNode>,_true,_false,_false>.
          super__Optional_payload_base<std::shared_ptr<ScriptAstNode>_>._M_payload._8_1_ == '\x01')
      {
        maybeScript.super__Optional_base<std::shared_ptr<ScriptAstNode>,_false,_false>._M_payload.
        super__Optional_payload<std::shared_ptr<ScriptAstNode>,_true,_false,_false>.
        super__Optional_payload_base<std::shared_ptr<ScriptAstNode>_>._M_payload._8_1_ = 0;
        if (maybeScript.super__Optional_base<std::shared_ptr<ScriptAstNode>,_false,_false>.
            _M_payload.super__Optional_payload<std::shared_ptr<ScriptAstNode>,_true,_false,_false>.
            super__Optional_payload_base<std::shared_ptr<ScriptAstNode>_>._M_payload._M_value.
            super___shared_ptr<ScriptAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     maybeScript.super__Optional_base<std::shared_ptr<ScriptAstNode>,_false,_false>.
                     _M_payload.
                     super__Optional_payload<std::shared_ptr<ScriptAstNode>,_true,_false,_false>.
                     super__Optional_payload_base<std::shared_ptr<ScriptAstNode>_>._M_payload.
                     _M_value.super___shared_ptr<ScriptAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        }
      }
      if (parser.super___shared_ptr<Parser,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   parser.super___shared_ptr<Parser,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      if (tokenBuffer.super___shared_ptr<TokenBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   tokenBuffer.super___shared_ptr<TokenBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      _Var2._M_pi = extraout_RDX;
      if (reader.super___shared_ptr<StringReader,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   reader.super___shared_ptr<StringReader,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        _Var2._M_pi = extraout_RDX_00;
      }
      sVar3.super___shared_ptr<ScriptAstNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           _Var2._M_pi;
      sVar3.super___shared_ptr<ScriptAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)out;
      return (shared_ptr<ScriptAstNode>)
             sVar3.super___shared_ptr<ScriptAstNode,_(__gnu_cxx::_Lock_policy)2>;
    }
  }
  exit(1);
}

Assistant:

std::shared_ptr<ScriptAstNode> parseScript(std::ostream & out, const std::string & data) {
  auto reader = std::make_shared<StringReader>(data);
  auto tokenizer = std::make_shared<Tokenizer>(reader);
  auto tokenBuffer = std::make_shared<TokenBuffer>(tokenizer);
  auto parser = std::make_shared<Parser>(tokenBuffer, out);

  auto maybeScript = parser->parseScript();

  if (!maybeScript) {
    exit(1);
  }

  auto script = maybeScript.value();

  auto analyzer = std::make_shared<SemanticAnalyzer>(out, reader);

  if (!analyzer->isValid(script)) {
    exit(1);
  }

  return script;
}